

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

uint8_t FpgaIO::GetEthernetPortStatusV3(uint32_t status,uint chan)

{
  uint uVar1;
  undefined1 local_11;
  uint8_t pstat;
  uint chan_local;
  uint32_t status_local;
  
  local_11 = '\0';
  uVar1 = BoardIO::GetFpgaVersionMajorFromStatus(status);
  if (uVar1 == 3) {
    if (chan == 1) {
      local_11 = (uint8_t)status;
    }
    else if (chan == 2) {
      local_11 = (uint8_t)(status >> 8);
    }
  }
  return local_11;
}

Assistant:

uint8_t FpgaIO::GetEthernetPortStatusV3(uint32_t status, unsigned int chan)
{
    uint8_t pstat = 0;
    if (GetFpgaVersionMajorFromStatus(status) == 3) {
        if (chan == 1)
            pstat = static_cast<uint8_t>(status&ETH_STAT_PORT1_MASK_V3);
        else if (chan == 2)
            pstat = static_cast<uint8_t>((status&ETH_STAT_PORT2_MASK_V3)>>8);
    }
    return pstat;
}